

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llog_message.cpp
# Opt level: O3

void __thiscall
ins::LLogMessage::LLogMessage(LLogMessage *this,string *file,string *function,int line,int level)

{
  char *__s;
  tm *__tp;
  pthread_t pVar1;
  ostream *poVar2;
  size_t sVar3;
  time_t now_c;
  char time_str [64];
  string local_a0;
  long local_80;
  char local_78 [72];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
  this->fatal_ = false;
  local_80 = std::chrono::_V2::system_clock::now();
  local_80 = local_80 / 1000000000;
  __tp = localtime(&local_80);
  strftime(local_78,0x40,"%m-%d %T",__tp);
  pVar1 = pthread_self();
  local_a0._M_dataplus._M_p._0_1_ = 0x5b;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_a0,1);
  if (pVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"thread::id of a non-executing thread",0x24);
  }
  else {
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  }
  local_a0._M_dataplus._M_p._0_1_ = 0x5d;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_a0,1);
  local_a0._M_dataplus._M_p._0_1_ = 0x5b;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_a0,1);
  __s = LLogMessage::level_description[level];
  sVar3 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
  local_a0._M_dataplus._M_p._0_1_ = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_a0,1);
  sVar3 = strlen(local_78);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_78,sVar3);
  local_a0._M_dataplus._M_p._0_1_ = 0x2e;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_a0,1);
  std::ostream::_M_insert<long>((long)poVar2);
  local_a0._M_dataplus._M_p._0_1_ = 0x20;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_a0,1);
  ParseFileName(&local_a0,this,file);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,(char *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_
                                    ),local_a0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_) !=
      &local_a0.field_2) {
    operator_delete((undefined1 *)
                    CONCAT71(local_a0._M_dataplus._M_p._1_7_,local_a0._M_dataplus._M_p._0_1_));
  }
  local_a0._M_dataplus._M_p._0_1_ = 0x3a;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,(char *)&local_a0,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,line);
  local_a0._M_dataplus._M_p._0_1_ = 0x5d;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_a0,1);
  return;
}

Assistant:

LLogMessage::LLogMessage(const std::string &file,
                         const std::string &function,
                         int line,
                         int level) {
  Ignore(function);
  static const char *level_description[] = {
    "VERBOSE",
    "INFO",
    "WARNING",
    "ERROR",
  };
  auto now = std::chrono::system_clock::now();
  auto log_time_ms = std::chrono::time_point_cast<std::chrono::milliseconds>(now);
  auto now_c = std::chrono::system_clock::to_time_t(log_time_ms);
  auto local_time = std::localtime(&now_c);
  char time_str[64];
  strftime(time_str, sizeof(time_str), "%m-%d %T", local_time);
  auto id = std::this_thread::get_id();
  oss_ << '[' << id << ']';
  oss_ << '[' << level_description[level];
  oss_ << ' ' << time_str << '.' << log_time_ms.time_since_epoch().count() % 1000;
  oss_ << ' ' << ParseFileName(file);
  oss_ << ':' << line << ']';
}